

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllContentModel.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AllContentModel::AllContentModel
          (AllContentModel *this,ContentSpecNode *parentContentSpec,bool isMixed,
          MemoryManager *manager)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  QName *this_00;
  QName **ppQVar3;
  bool *pbVar4;
  RuntimeException *this_01;
  ulong getAt;
  ValueVectorOf<xercesc_4_0::QName_*> local_80;
  ValueVectorOf<bool> local_58;
  
  (this->super_XMLContentModel)._vptr_XMLContentModel = (_func_int **)&PTR__AllContentModel_00404c30
  ;
  this->fMemoryManager = manager;
  this->fCount = 0;
  this->fChildren = (QName **)0x0;
  *(undefined8 *)((long)&this->fChildren + 4) = 0;
  *(undefined8 *)((long)&this->fChildOptional + 4) = 0;
  this->fIsMixed = isMixed;
  this->fHasOptionalContent = false;
  local_80.fCallDestructor = false;
  local_80.fCurCount = 0;
  local_80.fMaxCount = 0x40;
  local_80.fMemoryManager = manager;
  iVar1 = (*manager->_vptr_MemoryManager[3])(manager);
  local_80.fElemList = (QName **)CONCAT44(extraout_var,iVar1);
  memset(local_80.fElemList,0,0x200);
  local_58.fMemoryManager = this->fMemoryManager;
  local_58.fCallDestructor = false;
  local_58.fCurCount = 0;
  local_58.fMaxCount = 0x40;
  iVar1 = (*(local_58.fMemoryManager)->_vptr_MemoryManager[3])(local_58.fMemoryManager,0x40);
  local_58.fElemList = (bool *)CONCAT44(extraout_var_00,iVar1);
  local_58.fElemList[0x30] = false;
  local_58.fElemList[0x31] = false;
  local_58.fElemList[0x32] = false;
  local_58.fElemList[0x33] = false;
  local_58.fElemList[0x34] = false;
  local_58.fElemList[0x35] = false;
  local_58.fElemList[0x36] = false;
  local_58.fElemList[0x37] = false;
  local_58.fElemList[0x38] = false;
  local_58.fElemList[0x39] = false;
  local_58.fElemList[0x3a] = false;
  local_58.fElemList[0x3b] = false;
  local_58.fElemList[0x3c] = false;
  local_58.fElemList[0x3d] = false;
  local_58.fElemList[0x3e] = false;
  local_58.fElemList[0x3f] = false;
  local_58.fElemList[0x20] = false;
  local_58.fElemList[0x21] = false;
  local_58.fElemList[0x22] = false;
  local_58.fElemList[0x23] = false;
  local_58.fElemList[0x24] = false;
  local_58.fElemList[0x25] = false;
  local_58.fElemList[0x26] = false;
  local_58.fElemList[0x27] = false;
  local_58.fElemList[0x28] = false;
  local_58.fElemList[0x29] = false;
  local_58.fElemList[0x2a] = false;
  local_58.fElemList[0x2b] = false;
  local_58.fElemList[0x2c] = false;
  local_58.fElemList[0x2d] = false;
  local_58.fElemList[0x2e] = false;
  local_58.fElemList[0x2f] = false;
  local_58.fElemList[0x10] = false;
  local_58.fElemList[0x11] = false;
  local_58.fElemList[0x12] = false;
  local_58.fElemList[0x13] = false;
  local_58.fElemList[0x14] = false;
  local_58.fElemList[0x15] = false;
  local_58.fElemList[0x16] = false;
  local_58.fElemList[0x17] = false;
  local_58.fElemList[0x18] = false;
  local_58.fElemList[0x19] = false;
  local_58.fElemList[0x1a] = false;
  local_58.fElemList[0x1b] = false;
  local_58.fElemList[0x1c] = false;
  local_58.fElemList[0x1d] = false;
  local_58.fElemList[0x1e] = false;
  local_58.fElemList[0x1f] = false;
  local_58.fElemList[0] = false;
  local_58.fElemList[1] = false;
  local_58.fElemList[2] = false;
  local_58.fElemList[3] = false;
  local_58.fElemList[4] = false;
  local_58.fElemList[5] = false;
  local_58.fElemList[6] = false;
  local_58.fElemList[7] = false;
  local_58.fElemList[8] = false;
  local_58.fElemList[9] = false;
  local_58.fElemList[10] = false;
  local_58.fElemList[0xb] = false;
  local_58.fElemList[0xc] = false;
  local_58.fElemList[0xd] = false;
  local_58.fElemList[0xe] = false;
  local_58.fElemList[0xf] = false;
  if (parentContentSpec != (ContentSpecNode *)0x0) {
    if ((parentContentSpec->fType == All) && (parentContentSpec->fMinOccurs == 0)) {
      this->fHasOptionalContent = true;
    }
    buildChildList(this,parentContentSpec,&local_80,&local_58);
    this->fCount = local_80.fCurCount;
    iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,local_80.fCurCount << 3);
    this->fChildren = (QName **)CONCAT44(extraout_var_01,iVar1);
    iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,this->fCount);
    this->fChildOptional = (bool *)CONCAT44(extraout_var_02,iVar1);
    for (uVar2 = 0; getAt = (ulong)uVar2, getAt < this->fCount; uVar2 = uVar2 + 1) {
      this_00 = (QName *)XMemory::operator_new(0x48,this->fMemoryManager);
      ppQVar3 = ValueVectorOf<xercesc_4_0::QName_*>::elementAt(&local_80,getAt);
      QName::QName(this_00,*ppQVar3);
      this->fChildren[getAt] = this_00;
      pbVar4 = ValueVectorOf<bool>::elementAt(&local_58,getAt);
      this->fChildOptional[getAt] = *pbVar4;
    }
    ValueVectorOf<bool>::~ValueVectorOf(&local_58);
    ValueVectorOf<xercesc_4_0::QName_*>::~ValueVectorOf(&local_80);
    return;
  }
  this_01 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/AllContentModel.cpp"
             ,0x44,CM_NoParentCSN,this->fMemoryManager);
  __cxa_throw(this_01,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

AllContentModel::AllContentModel( ContentSpecNode* const parentContentSpec
                                , const bool             isMixed
                                , MemoryManager* const   manager) :
   fMemoryManager(manager)
 , fCount(0)
 , fChildren(0)
 , fChildOptional(0)
 , fNumRequired(0)
 , fIsMixed(isMixed)
 , fHasOptionalContent(false)
{
    //
    //  Create a vector of unsigned ints that will be filled in with the
    //  ids of the child nodes. It will be expanded as needed but we give
    //  it an initial capacity of 64 which should be more than enough for
    //  99% of the scenarios.
    //

    ValueVectorOf<QName*> children(64, fMemoryManager);
    ValueVectorOf<bool> childOptional(64, fMemoryManager);

    //
    //  Get the parent element's content spec. This is the head of the tree
    //  of nodes that describes the content model. We will iterate this
    //  tree.
    //
    ContentSpecNode* curNode = parentContentSpec;
    if (!curNode)
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_NoParentCSN, fMemoryManager);

    // And now call the private recursive method that iterates the tree
    if (curNode->getType() == ContentSpecNode::All
        && curNode->getMinOccurs() == 0) {
        fHasOptionalContent = true;
    }
    buildChildList(curNode, children, childOptional);

    //
    //  And now we know how many elements we need in our member list. So
    //  fill them in.
    //
    fCount = children.size();
    fChildren = (QName**) fMemoryManager->allocate(fCount * sizeof(QName*)); //new QName*[fCount];
    fChildOptional = (bool*) fMemoryManager->allocate(fCount * sizeof(bool)); //new bool[fCount];
    for (unsigned int index = 0; index < fCount; index++) {
        fChildren[index] = new (fMemoryManager) QName(*(children.elementAt(index)));
        fChildOptional[index] = childOptional.elementAt(index);
    }
}